

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegAudioStreamReader.cpp
# Opt level: O0

string * __thiscall
MpegAudioStreamReader::getStreamInfo_abi_cxx11_
          (string *__return_storage_ptr__,MpegAudioStreamReader *this)

{
  ostream *poVar1;
  ostringstream local_190 [8];
  ostringstream str;
  MpegAudioStreamReader *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"Bitrate: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_MP3Codec).m_bit_rate / 1000);
  std::operator<<(poVar1,"Kbps  ");
  poVar1 = std::operator<<((ostream *)local_190,"Sample Rate: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_MP3Codec).m_sample_rate / 1000);
  std::operator<<(poVar1,"KHz  ");
  poVar1 = std::operator<<((ostream *)local_190,"Channels: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_MP3Codec).m_nb_channels);
  std::operator<<(poVar1,"  ");
  poVar1 = std::operator<<((ostream *)local_190,"Layer: ");
  std::ostream::operator<<(poVar1,(int)(this->super_MP3Codec).m_layer);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

const std::string MpegAudioStreamReader::getStreamInfo()
{
    std::ostringstream str;
    str << "Bitrate: " << m_bit_rate / 1000 << "Kbps  ";
    str << "Sample Rate: " << m_sample_rate / 1000 << "KHz  ";
    str << "Channels: " << m_nb_channels << "  ";
    str << "Layer: " << static_cast<int>(m_layer);
    return str.str();
}